

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<std::__cxx11::string&,char>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,char *b)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_b8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_80;
  string_view local_68;
  string *local_58;
  cmAlphaNum local_50;
  
  local_50.RValueString_ = (string *)0x0;
  local_50.View_._M_str = (a->_M_dataplus)._M_p;
  local_50.View_._M_len = a->_M_string_length;
  local_80.first = cmAlphaNum::View(&local_50);
  local_80.second = local_50.RValueString_;
  local_b8.Digits_[0] = *b;
  local_b8.View_._M_str = local_b8.Digits_;
  local_b8.RValueString_ = (string *)0x0;
  local_b8.View_._M_len = 1;
  local_68 = cmAlphaNum::View(&local_b8);
  local_58 = local_b8.RValueString_;
  views._M_len = 2;
  views._M_array = &local_80;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}